

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Comments::set(Comments *this,CommentPlacement slot,String *comment)

{
  bool bVar1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *this_00;
  type this_01;
  reference this_02;
  unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  local_28;
  String *local_20;
  String *comment_local;
  Comments *pCStack_10;
  CommentPlacement slot_local;
  Comments *this_local;
  
  if ((int)slot < 3) {
    local_20 = comment;
    comment_local._4_4_ = slot;
    pCStack_10 = this;
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
    if (!bVar1) {
      this_00 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                 *)operator_new(0x60);
      memset(this_00,0,0x60);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
      array(this_00);
      std::
      unique_ptr<std::array<std::__cxx11::string,3ul>,std::default_delete<std::array<std::__cxx11::string,3ul>>>
      ::unique_ptr<std::default_delete<std::array<std::__cxx11::string,3ul>>,void>
                ((unique_ptr<std::array<std::__cxx11::string,3ul>,std::default_delete<std::array<std::__cxx11::string,3ul>>>
                  *)&local_28,this_00);
      std::
      unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ::operator=(&this->ptr_,&local_28);
      std::
      unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ::~unique_ptr(&local_28);
    }
    this_01 = std::
              unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              ::operator*(&this->ptr_);
    this_02 = std::
              array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              ::operator[](this_01,(ulong)comment_local._4_4_);
    std::__cxx11::string::operator=((string *)this_02,(string *)comment);
  }
  return;
}

Assistant:

void Value::Comments::set(CommentPlacement slot, String comment) {
  if (slot >= CommentPlacement::numberOfCommentPlacement)
    return;
  if (!ptr_)
    ptr_ = std::unique_ptr<Array>(new Array());
  (*ptr_)[slot] = std::move(comment);
}